

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall Potassco::ProgramOptions::ContextError::~ContextError(ContextError *this)

{
  ~ContextError(this);
  operator_delete(this);
  return;
}

Assistant:

~ContextError() throw () {}